

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_function_list.cpp
# Opt level: O2

bool __thiscall ON_FunctionList::CallFunctions(ON_FunctionList *this,bool bFirstToLast)

{
  void *pvVar1;
  bool bVar2;
  void **ppvVar3;
  
  bVar2 = ON_Lock::GetDefaultLock(&this->m_lock);
  if (bVar2) {
    if (bFirstToLast) {
      ppvVar3 = &this->m_head;
      while (pvVar1 = *ppvVar3, pvVar1 != (void *)0x0) {
        (**(code **)((long)pvVar1 + 0x10))(*(undefined8 *)((long)pvVar1 + 0x18));
        ppvVar3 = (void **)((long)pvVar1 + 8);
      }
    }
    else {
      ppvVar3 = &this->m_tail;
      while (ppvVar3 = (void **)*ppvVar3, ppvVar3 != (void **)0x0) {
        (*(code *)ppvVar3[2])(ppvVar3[3]);
      }
    }
    ON_Lock::ReturnDefaultLock(&this->m_lock);
  }
  return bVar2;
}

Assistant:

bool ON_FunctionList::CallFunctions(
  bool bFirstToLast
  )
{
  if ( false == m_lock.GetDefaultLock() )
    return false;

  if ( bFirstToLast )
  {
    for ( struct tagFunctionItem* item = (struct tagFunctionItem*)m_head; item; item = item->m_next )
    {
      item->m_function(item->m_function_parameter);
    }
  }
  else
  {
    for ( struct tagFunctionItem* item = (struct tagFunctionItem*)m_tail; item; item = item->m_prev )
    {
      item->m_function(item->m_function_parameter);
    }
  }
    
  m_lock.ReturnDefaultLock();

  return true;
}